

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

IFStmt * new_if_stmt(void *expr,void *block,void *els)

{
  Token *pTVar1;
  void *pvVar2;
  IFStmt *pIVar3;
  undefined8 *puVar4;
  
  pvVar2 = malloc(0x28);
  pIVar3 = (IFStmt *)require_not_null(pvVar2,"Failed to allocate space");
  pvVar2 = malloc(0x10);
  puVar4 = (undefined8 *)require_not_null(pvVar2,"Failed to allocate space");
  puVar4[1] = 0;
  *puVar4 = if_eval;
  pTVar1 = (Token *)puVar4[1];
  (pIVar3->node).eval = (eval_handler_)*puVar4;
  (pIVar3->node).token = pTVar1;
  pIVar3->expr = expr;
  pIVar3->block = block;
  pIVar3->els = els;
  return pIVar3;
}

Assistant:

IFStmt* new_if_stmt(void* expr, void* block, void* els){
    IFStmt* stmt = new(IFStmt);
    stmt->node = tree_node_(NULL, eval_handler(if_eval));
    stmt->expr = expr;
    stmt->block = block;
    stmt->els = els;
    return stmt;
}